

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeViewport(ImGuiViewportP *viewport)

{
  uint uVar1;
  ImDrawList **ppIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  ImGuiViewportP *viewport_00;
  char *pcVar8;
  long lVar9;
  long lVar10;
  
  pIVar3 = GImGui;
  SetNextItemOpen(true,2);
  bVar4 = TreeNode("viewport0","Viewport #%d",0);
  bVar5 = IsItemHovered(0);
  if (bVar5) {
    (pIVar3->DebugMetricsConfig).HighlightViewportID = (viewport->super_ImGuiViewport).ID;
  }
  if (bVar4) {
    uVar1 = (viewport->super_ImGuiViewport).Flags;
    BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f"
               ,(double)(viewport->super_ImGuiViewport).Pos.x,
               (double)(viewport->super_ImGuiViewport).Pos.y,
               (double)(viewport->super_ImGuiViewport).Size.x,
               (double)(viewport->super_ImGuiViewport).Size.y,(double)(viewport->WorkOffsetMin).x,
               (double)(viewport->WorkOffsetMin).y,(double)(viewport->WorkOffsetMax).x,
               (double)(viewport->WorkOffsetMax).y);
    viewport_00 = (ImGuiViewportP *)(ulong)(uint)(viewport->super_ImGuiViewport).Flags;
    pcVar7 = " IsPlatformWindow";
    if ((uVar1 & 1) == 0) {
      pcVar7 = "";
    }
    pcVar6 = " IsPlatformMonitor";
    if ((uVar1 & 2) == 0) {
      pcVar6 = "";
    }
    pcVar8 = " OwnedByApp";
    if ((uVar1 & 4) == 0) {
      pcVar8 = "";
    }
    BulletText("Flags: 0x%04X =%s%s%s",viewport_00,pcVar7,pcVar6,pcVar8);
    lVar10 = (long)(viewport->DrawDataP).CmdLists.Size;
    if (lVar10 != 0) {
      ppIVar2 = (viewport->DrawDataP).CmdLists.Data;
      lVar9 = 0;
      do {
        DebugNodeDrawList((ImGuiWindow *)0x0,viewport_00,*(ImDrawList **)((long)ppIVar2 + lVar9),
                          "DrawList");
        lVar9 = lVar9 + 8;
      } while (lVar10 * 8 != lVar9);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeViewport(ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    SetNextItemOpen(true, ImGuiCond_Once);
    bool open = TreeNode("viewport0", "Viewport #%d", 0);
    if (IsItemHovered())
        g.DebugMetricsConfig.HighlightViewportID = viewport->ID;
    if (open)
    {
        ImGuiWindowFlags flags = viewport->Flags;
        BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f",
            viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
            viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y);
        BulletText("Flags: 0x%04X =%s%s%s", viewport->Flags,
            (flags & ImGuiViewportFlags_IsPlatformWindow)  ? " IsPlatformWindow"  : "",
            (flags & ImGuiViewportFlags_IsPlatformMonitor) ? " IsPlatformMonitor" : "",
            (flags & ImGuiViewportFlags_OwnedByApp)        ? " OwnedByApp"        : "");
        for (ImDrawList* draw_list : viewport->DrawDataP.CmdLists)
            DebugNodeDrawList(NULL, viewport, draw_list, "DrawList");
        TreePop();
    }
}